

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

void liblogger::LogManager::Send(LogType Type,string *str)

{
  char cVar1;
  undefined8 *puVar2;
  long *plVar3;
  LogManagerScopedLock lock;
  
  LogMutex::Lock((LogMutex *)m_mutex);
  m_TotalMessages = m_TotalMessages + 1;
  if ((int)Type < m_Type) {
    plVar3 = &m_TotalDroppedMessages;
  }
  else {
    plVar3 = &m_TotalFiltered;
    puVar2 = &m_filters_abi_cxx11_;
    do {
      puVar2 = (undefined8 *)*puVar2;
      if (puVar2 == &m_filters_abi_cxx11_) {
        puVar2 = &m_loggers_abi_cxx11_;
        while (puVar2 = (undefined8 *)*puVar2, puVar2 != &m_loggers_abi_cxx11_) {
          (**(code **)(*(long *)puVar2[2] + 0x28))((long *)puVar2[2],Type,str);
        }
        goto LAB_00131d69;
      }
      cVar1 = (**(code **)(*(long *)puVar2[2] + 0x10))((long *)puVar2[2],Type,str);
    } while (cVar1 == '\0');
  }
  *plVar3 = *plVar3 + 1;
LAB_00131d69:
  LogMutex::Unlock((LogMutex *)m_mutex);
  return;
}

Assistant:

void LogManager::Send(const LogType Type, const std::string &str)
{
	LogManagerScopedLock lock = LogManagerScopedLock();

	try
	{
		m_TotalMessages++;
		if (Type < m_Type)
		{
			m_TotalDroppedMessages++;
			return;
		}

		//Filter any messages
		for(auto &it : m_filters) {
			bool filter = it->Filter(Type, str);
			if (filter) {
				m_TotalFiltered++;
				return;
			}
		}

		//Send to all loggers
		for(auto &it : m_loggers) {
			it->Log(Type, str);
		}
	}
	catch(LogException &ex)
	{
		m_TotalErrors++;
		if (m_catcherrors == false)
		{
			throw(ex);
		}
	}
}